

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_decode_data_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::
ObjCHelperDeathTest_TextFormatDecodeData_DecodeDataForString_Failures_Test::
~ObjCHelperDeathTest_TextFormatDecodeData_DecodeDataForString_Failures_Test
          (ObjCHelperDeathTest_TextFormatDecodeData_DecodeDataForString_Failures_Test *this)

{
  ObjCHelperDeathTest_TextFormatDecodeData_DecodeDataForString_Failures_Test *this_local;
  
  ~ObjCHelperDeathTest_TextFormatDecodeData_DecodeDataForString_Failures_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjCHelperDeathTest, TextFormatDecodeData_DecodeDataForString_Failures) {
  // Empty inputs.

  EXPECT_DEATH(TextFormatDecodeData::DecodeDataForString("", ""),
               "error: got empty string for making TextFormat data, input:");
  EXPECT_DEATH(TextFormatDecodeData::DecodeDataForString("a", ""),
               "error: got empty string for making TextFormat data, input:");
  EXPECT_DEATH(TextFormatDecodeData::DecodeDataForString("", "a"),
               "error: got empty string for making TextFormat data, input:");

  // Null char in the string.

  std::string str_with_null_char("ab\0c", 4);
  EXPECT_DEATH(
      TextFormatDecodeData::DecodeDataForString(str_with_null_char, "def"),
      "error: got a null char in a string for making TextFormat data, input:");
  EXPECT_DEATH(
      TextFormatDecodeData::DecodeDataForString("def", str_with_null_char),
      "error: got a null char in a string for making TextFormat data, input:");
}